

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParallelContext.cpp
# Opt level: O1

void __thiscall
amrex::ParallelContext::Frame::global_to_local_rank(Frame *this,int *local,int *global,size_t n)

{
  if (n != 0) {
    memset(local,0,n << 2);
    return;
  }
  return;
}

Assistant:

void
Frame::global_to_local_rank (int* local, const int* global, std::size_t n) const
{
#ifdef BL_USE_MPI
    if (frames.size() > 1)
    {
      MPI_Group_translate_ranks(GroupAll(), n, const_cast<int*>(global), GroupSub(), local);
    }
    else
    {
        for (std::size_t i = 0; i < n; ++i) local[i] = global[i];
    }
#else
    amrex::ignore_unused(global);
    for (std::size_t i = 0; i < n; ++i) local[i] = 0;
#endif
}